

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setPivot(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_stage,int p_col,int p_row,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val)

{
  type_conflict5 tVar1;
  element_type *this_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined4 *in_RDI;
  cpp_dec_float<100U,_int,_void> *in_R8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffc88;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffca0;
  undefined1 local_310 [80];
  undefined1 local_2c0 [160];
  Real local_220;
  undefined1 local_218 [160];
  undefined8 local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_170;
  undefined1 local_120 [92];
  int local_c4;
  undefined8 local_b0;
  undefined8 *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_90;
  reference local_88;
  undefined1 *local_80;
  reference local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined4 *local_60;
  undefined1 *local_58;
  reference local_50;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  cpp_dec_float<100U,_int,_void> *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  cpp_dec_float<100U,_int,_void> *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  *(int *)(*(long *)(in_RDI + 0x68) + (long)in_ESI * 4) = in_ECX;
  *(int *)(*(long *)(in_RDI + 0x6c) + (long)in_ESI * 4) = in_EDX;
  *(int *)(*(long *)(in_RDI + 0x6a) + (long)in_ECX * 4) = in_ESI;
  *(int *)(*(long *)(in_RDI + 0x6e) + (long)in_EDX * 4) = in_ESI;
  local_178 = 0x3ff0000000000000;
  local_a0 = &local_170;
  local_a8 = &local_178;
  local_b0 = 0;
  local_c4 = in_ECX;
  local_48 = local_a8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffca0,(double)in_RDI,in_R8);
  local_28 = local_120;
  local_30 = &local_170;
  local_38 = in_R8;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_30,
             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)in_R8);
  local_20 = local_120;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_R8);
  local_8 = local_120;
  local_10 = local_30;
  local_18 = local_38;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (in_R8,in_stack_fffffffffffffc88,(cpp_dec_float<100U,_int,_void> *)0x537b70);
  local_50 = std::
             vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           *)(in_RDI + 0x92),(long)local_c4);
  local_58 = local_120;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (in_R8,in_stack_fffffffffffffc88);
  local_90 = local_218;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_R8,in_stack_fffffffffffffc88);
  spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)in_stack_fffffffffffffc88);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x537c0e);
  local_220 = Tolerances::epsilonPivot(this_00);
  tVar1 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffffc88,(double *)0x537c34);
  if (tVar1) {
    *in_RDI = 2;
  }
  local_88 = std::
             vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           *)(in_RDI + 0x92),(long)local_c4);
  local_80 = local_2c0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_R8,in_stack_fffffffffffffc88);
  spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)in_stack_fffffffffffffc88);
  tVar1 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffffc88,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x537cb6);
  if (tVar1) {
    local_78 = std::
               vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             *)(in_RDI + 0x92),(long)local_c4);
    local_70 = &stack0xfffffffffffffca0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_R8,in_stack_fffffffffffffc88);
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_fffffffffffffc88);
    local_60 = in_RDI + 0x17;
    local_68 = local_310;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_R8,in_stack_fffffffffffffc88);
  }
  return;
}

Assistant:

void CLUFactor<R>::setPivot(const int p_stage,
                            const int p_col,
                            const int p_row,
                            const R val)
{
   assert(row.perm[p_row] < 0);
   assert(col.perm[p_col] < 0);

   row.orig[p_stage] = p_row;
   col.orig[p_stage] = p_col;
   row.perm[p_row]   = p_stage;
   col.perm[p_col]   = p_stage;
   diag[p_row]       = R(1.0) / val;

   if(spxAbs(val) < _tolerances->epsilonPivot())
   {
#ifndef NDEBUG
      SPX_MSG_ERROR(std::cerr
                    << "LU pivot element is almost zero (< "
                    << _tolerances->epsilonPivot()
                    << ") - Basis is numerically singular"
                    << std::endl;)
#endif
      this->stat = SLinSolver<R>::SINGULAR;
   }

   if(spxAbs(diag[p_row]) > maxabs)
      maxabs = spxAbs(diag[p_row]);
}